

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::ConsumeField(ParserImpl *this,Message *message)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  Finder *pFVar3;
  size_t __n;
  string **ppsVar4;
  char *pcVar5;
  pointer __n_00;
  int32_t number;
  size_type __n_01;
  bool bVar6;
  char cVar7;
  bool bVar8;
  int iVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ExtensionRange *pEVar10;
  undefined4 extraout_var_01;
  FieldDescriptor *field;
  Descriptor *pDVar11;
  Descriptor *pDVar12;
  ReservedRange *pRVar13;
  FieldDescriptor *pFVar14;
  MessageFactory *factory;
  MessageLite *this_00;
  string *psVar15;
  Reflection *this_01;
  ulong uVar16;
  _Alloc_hider _Var17;
  size_type __rlen;
  ulong uVar18;
  OneofDescriptor *oneof_descriptor;
  string_view name;
  string_view name_00;
  string_view lowercase_name;
  string_view data;
  string_view printable_name;
  ParseLocationRange range;
  Metadata MVar19;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view message_08;
  undefined1 local_258 [48];
  int32_t val;
  char *local_220;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_218;
  char local_208 [8];
  char *local_200;
  size_type local_1f8;
  pointer local_1f0;
  undefined8 local_1e8;
  char *local_1e0;
  string field_name;
  string prefix_and_full_type_name;
  string full_type_name;
  FieldDescriptor *any_value_field;
  FieldDescriptor *any_type_url_field;
  Descriptor *local_158;
  string serialized_value;
  undefined1 local_130 [48];
  ParserImpl *local_100;
  pointer local_f8;
  ulong local_f0;
  ulong local_e8;
  string local_e0;
  string local_c0;
  string prefix;
  undefined1 local_70 [32];
  string local_50;
  undefined4 extraout_var_02;
  
  MVar19 = Message::GetMetadata(message);
  this_01 = MVar19.reflection;
  MVar19 = Message::GetMetadata(message);
  pDVar11 = MVar19.descriptor;
  field_name._M_dataplus._M_p = (pointer)&field_name.field_2;
  field_name._M_string_length = 0;
  field_name.field_2._M_local_buf[0] = '\0';
  local_f0 = (ulong)(uint)(this->tokenizer_).current_.line;
  local_e8 = (ulong)(uint)(this->tokenizer_).current_.column;
  bVar6 = internal::GetAnyFieldDescriptors(message,&any_type_url_field,&any_value_field);
  if (bVar6) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"[","");
    bVar6 = TryConsume(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    bVar6 = false;
  }
  if (bVar6 != false) {
    full_type_name._M_string_length = 0;
    full_type_name.field_2._M_local_buf[0] = '\0';
    prefix._M_string_length = 0;
    prefix.field_2._M_local_buf[0] = '\0';
    full_type_name._M_dataplus._M_p = (pointer)&full_type_name.field_2;
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    bVar6 = ConsumeAnyTypeUrl(this,&full_type_name,&prefix);
    if (bVar6) {
      _val = (pointer)prefix._M_string_length;
      local_220 = prefix._M_dataplus._M_p;
      local_258._0_8_ = full_type_name._M_string_length;
      local_258._8_8_ = full_type_name._M_dataplus._M_p;
      absl::lts_20240722::StrCat_abi_cxx11_((AlphaNum *)&prefix_and_full_type_name,(AlphaNum *)&val)
      ;
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar6 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (bVar6) {
        TryConsumeWhitespace(this);
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
        bVar6 = TryConsumeBeforeWhitespace(this,(string *)&val);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
        if (bVar6) {
          TryConsumeWhitespace(this);
        }
        paVar1 = &serialized_value.field_2;
        serialized_value._M_string_length = 0;
        serialized_value.field_2._M_local_buf[0] = '\0';
        pFVar3 = this->finder_;
        serialized_value._M_dataplus._M_p = (pointer)paVar1;
        if (pFVar3 == (Finder *)0x0) {
          pDVar11 = anon_unknown_1::DefaultFinderFindAnyType(message,&prefix,&full_type_name);
        }
        else {
          iVar9 = (*pFVar3->_vptr_Finder[4])(pFVar3,message,&prefix,&full_type_name);
          pDVar11 = (Descriptor *)CONCAT44(extraout_var,iVar9);
        }
        if (pDVar11 == (Descriptor *)0x0) {
          _val = (pointer)0x15;
          local_220 = "Could not find type \"";
          local_258._0_8_ = prefix_and_full_type_name._M_string_length;
          local_258._8_8_ = prefix_and_full_type_name._M_dataplus._M_p;
          local_130._0_8_ = (pointer)0x20;
          local_130._8_8_ = "\" stored in google.protobuf.Any.";
          absl::lts_20240722::StrCat_abi_cxx11_
                    ((AlphaNum *)local_70,(AlphaNum *)&val,(AlphaNum *)local_258);
          message_01._M_str = (char *)local_70._0_8_;
          message_01._M_len = local_70._8_8_;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_01);
          if ((undefined1 *)local_70._0_8_ != local_70 + 0x10) {
            operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
          }
LAB_003071bb:
          bVar6 = false;
        }
        else {
          bVar6 = ConsumeAnyValue(this,pDVar11,&serialized_value);
          if (!bVar6) goto LAB_003071bb;
          if ((this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) &&
             (((bVar6 = FieldDescriptor::is_repeated(any_type_url_field), !bVar6 &&
               (bVar6 = Reflection::HasField(this_01,message,any_type_url_field), bVar6)) ||
              ((bVar6 = FieldDescriptor::is_repeated(any_value_field), !bVar6 &&
               (bVar6 = Reflection::HasField(this_01,message,any_value_field), bVar6)))))) {
            message_00._M_str = "Non-repeated Any specified multiple times.";
            message_00._M_len = 0x2a;
            ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                        message_00);
            goto LAB_003071bb;
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)prefix_and_full_type_name._M_dataplus._M_p == &prefix_and_full_type_name.field_2) {
            local_c0.field_2._8_8_ = prefix_and_full_type_name.field_2._8_8_;
            local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
          }
          else {
            local_c0._M_dataplus._M_p = prefix_and_full_type_name._M_dataplus._M_p;
          }
          local_c0.field_2._M_allocated_capacity._1_7_ =
               prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_;
          local_c0.field_2._M_local_buf[0] = prefix_and_full_type_name.field_2._M_local_buf[0];
          local_c0._M_string_length = prefix_and_full_type_name._M_string_length;
          prefix_and_full_type_name._M_string_length = 0;
          prefix_and_full_type_name.field_2._M_local_buf[0] = '\0';
          prefix_and_full_type_name._M_dataplus._M_p = (pointer)&prefix_and_full_type_name.field_2;
          Reflection::SetString(this_01,message,any_type_url_field,&local_c0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
            operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)serialized_value._M_dataplus._M_p == paVar1) {
            local_e0.field_2._8_8_ = serialized_value.field_2._8_8_;
            local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
          }
          else {
            local_e0._M_dataplus._M_p = serialized_value._M_dataplus._M_p;
          }
          local_e0.field_2._M_allocated_capacity._1_7_ =
               serialized_value.field_2._M_allocated_capacity._1_7_;
          local_e0.field_2._M_local_buf[0] = serialized_value.field_2._M_local_buf[0];
          local_e0._M_string_length = serialized_value._M_string_length;
          serialized_value._M_string_length = 0;
          serialized_value.field_2._M_local_buf[0] = '\0';
          serialized_value._M_dataplus._M_p = (pointer)paVar1;
          Reflection::SetString(this_01,message,any_value_field,&local_e0);
          bVar6 = true;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
            operator_delete(local_e0._M_dataplus._M_p,local_e0.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)serialized_value._M_dataplus._M_p != paVar1) {
          operator_delete(serialized_value._M_dataplus._M_p,
                          CONCAT71(serialized_value.field_2._M_allocated_capacity._1_7_,
                                   serialized_value.field_2._M_local_buf[0]) + 1);
        }
      }
      else {
        bVar6 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
        operator_delete(prefix_and_full_type_name._M_dataplus._M_p,
                        CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                                 prefix_and_full_type_name.field_2._M_local_buf[0]) + 1);
      }
    }
    else {
      bVar6 = false;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p,
                      CONCAT71(prefix.field_2._M_allocated_capacity._1_7_,
                               prefix.field_2._M_local_buf[0]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
      operator_delete(full_type_name._M_dataplus._M_p,
                      CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                               full_type_name.field_2._M_local_buf[0]) + 1);
    }
    goto LAB_00308118;
  }
  _val = (pointer)&local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
  bVar6 = TryConsume(this,(string *)&val);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)_val != &local_218) {
    operator_delete(_val,local_218._M_allocated_capacity + 1);
  }
  if (bVar6) {
    bVar6 = ConsumeFullTypeName(this,&field_name);
    if (bVar6) {
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"]","");
      bVar6 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (bVar6) {
        TryConsumeWhitespace(this);
        pFVar3 = this->finder_;
        if (pFVar3 == (Finder *)0x0) {
          MVar19 = Message::GetMetadata(message);
          printable_name._M_str = field_name._M_dataplus._M_p;
          printable_name._M_len = field_name._M_string_length;
          pFVar14 = DescriptorPool::FindExtensionByPrintableName
                              ((MVar19.descriptor)->file_->pool_,MVar19.descriptor,printable_name);
        }
        else {
          iVar9 = (*pFVar3->_vptr_Finder[2])(pFVar3,message,&field_name);
          pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_00,iVar9);
        }
        if (pFVar14 == (FieldDescriptor *)0x0) {
          if ((this->allow_unknown_field_ != false) || (this->allow_unknown_extension_ != false)) {
            local_1f0 = pDVar11->all_names_[1]._M_dataplus._M_p;
            local_1f8 = pDVar11->all_names_[1]._M_string_length;
            _val = (pointer)0x14;
            local_220 = "Ignoring extension \"";
            local_218._M_allocated_capacity = field_name._M_string_length;
            local_218._8_8_ = field_name._M_dataplus._M_p;
            local_208[0] = '2';
            local_208[1] = '\0';
            local_208[2] = '\0';
            local_208[3] = '\0';
            local_208[4] = '\0';
            local_208[5] = '\0';
            local_208[6] = '\0';
            local_208[7] = '\0';
            local_200 = "\" which is not defined or is not an extension of \"";
            local_1e8 = 2;
            local_1e0 = "\".";
            absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_258,&val,5);
            message_02._M_str = (char *)local_258._0_8_;
            message_02._M_len = local_258._8_8_;
            ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                          message_02);
            if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            pFVar14 = (FieldDescriptor *)0x0;
            goto LAB_0030737d;
          }
          local_1f0 = pDVar11->all_names_[1]._M_dataplus._M_p;
          local_1f8 = pDVar11->all_names_[1]._M_string_length;
          _val = (pointer)0xb;
          local_220 = "Extension \"";
          local_218._M_allocated_capacity = field_name._M_string_length;
          local_218._8_8_ = field_name._M_dataplus._M_p;
          local_208[0] = ',';
          local_208[1] = '\0';
          local_208[2] = '\0';
          local_208[3] = '\0';
          local_208[4] = '\0';
          local_208[5] = '\0';
          local_208[6] = '\0';
          local_208[7] = '\0';
          local_200 = "\" is not defined or is not an extension of \"";
          local_1e8 = 2;
          local_1e0 = "\".";
          absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_258,&val,5);
          message_03._M_str = (char *)local_258._0_8_;
          message_03._M_len = local_258._8_8_;
          ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                      message_03);
          goto LAB_00307d0d;
        }
LAB_0030737d:
        bVar6 = false;
        goto LAB_003077b7;
      }
    }
    goto LAB_00308116;
  }
  bVar6 = ConsumeIdentifierBeforeWhitespace(this,&field_name);
  if (!bVar6) goto LAB_00308116;
  TryConsumeWhitespace(this);
  if ((this->allow_field_number_ == true) &&
     (cVar7 = absl::lts_20240722::numbers_internal::safe_strto32_base
                        (field_name._M_string_length,field_name._M_dataplus._M_p,&val),
     _Var17._M_p = _val, cVar7 != '\0')) {
    number = val;
    pEVar10 = Descriptor::FindExtensionRangeContainingNumber(pDVar11,val);
    if (pEVar10 == (ExtensionRange *)0x0) {
      pRVar13 = Descriptor::FindReservedRangeContainingNumber(pDVar11,number);
      if (pRVar13 != (ReservedRange *)0x0) {
        bVar6 = true;
        pFVar14 = (FieldDescriptor *)0x0;
        goto LAB_003076ed;
      }
      pFVar14 = Descriptor::FindFieldByNumber(pDVar11,number);
    }
    else {
      pFVar3 = this->finder_;
      if (pFVar3 == (Finder *)0x0) {
        pFVar14 = DescriptorPool::FindExtensionByNumber(pDVar11->file_->pool_,pDVar11,number);
      }
      else {
        iVar9 = (*pFVar3->_vptr_Finder[3])(pFVar3,pDVar11,(ulong)_Var17._M_p & 0xffffffff);
        pFVar14 = (FieldDescriptor *)CONCAT44(extraout_var_01,iVar9);
      }
    }
LAB_003076ea:
    bVar6 = false;
  }
  else {
    name._M_str = field_name._M_dataplus._M_p;
    name._M_len = field_name._M_string_length;
    pFVar14 = Descriptor::FindFieldByName(pDVar11,name);
    if (pFVar14 == (FieldDescriptor *)0x0) {
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&val,field_name._M_dataplus._M_p,
                 field_name._M_dataplus._M_p + field_name._M_string_length);
      absl::lts_20240722::AsciiStrToLower((string *)&val);
      name_00._M_str = _val;
      name_00._M_len = (size_t)local_220;
      field = Descriptor::FindFieldByName(pDVar11,name_00);
      if (field == (FieldDescriptor *)0x0) {
        pFVar14 = (FieldDescriptor *)0x0;
      }
      else {
        bVar6 = internal::cpp::IsGroupLike(field);
        pFVar14 = (FieldDescriptor *)0x0;
        if (bVar6) {
          pFVar14 = field;
        }
      }
      if (pFVar14 == (FieldDescriptor *)0x0) {
LAB_003073c6:
        pFVar14 = (FieldDescriptor *)0x0;
      }
      else {
        pDVar12 = FieldDescriptor::message_type(pFVar14);
        __n = pDVar12->all_names_->_M_string_length;
        if (__n != field_name._M_string_length) goto LAB_003073c6;
        if (__n != 0) {
          iVar9 = bcmp((pDVar12->all_names_->_M_dataplus)._M_p,field_name._M_dataplus._M_p,__n);
          if (iVar9 != 0) {
            pFVar14 = (FieldDescriptor *)0x0;
          }
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
    }
    if (pFVar14 == (FieldDescriptor *)0x0) {
      if (this->allow_case_insensitive_field_ == true) {
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&val,field_name._M_dataplus._M_p,
                   field_name._M_dataplus._M_p + field_name._M_string_length);
        absl::lts_20240722::AsciiStrToLower((string *)&val);
        lowercase_name._M_str = _val;
        lowercase_name._M_len = (size_t)local_220;
        pFVar14 = Descriptor::FindFieldByLowercaseName(pDVar11,lowercase_name);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
      }
      else {
        pFVar14 = (FieldDescriptor *)0x0;
      }
    }
    __n_01 = field_name._M_string_length;
    if (pFVar14 != (FieldDescriptor *)0x0) goto LAB_003076ea;
    uVar18 = (ulong)pDVar11->reserved_name_count_;
    bVar6 = 0 < (long)uVar18;
    local_158 = pDVar11;
    local_100 = this;
    if (0 < (long)uVar18) {
      local_f8 = field_name._M_dataplus._M_p;
      ppsVar4 = pDVar11->reserved_names_;
      bVar6 = true;
      uVar16 = 1;
      do {
        if ((ppsVar4[uVar16 - 1]->_M_string_length == __n_01) &&
           ((__n_01 == 0 ||
            (iVar9 = bcmp(local_f8,(ppsVar4[uVar16 - 1]->_M_dataplus)._M_p,__n_01), iVar9 == 0))))
        break;
        bVar6 = uVar16 < uVar18;
        bVar8 = uVar16 != uVar18;
        uVar16 = uVar16 + 1;
      } while (bVar8);
    }
    pFVar14 = (FieldDescriptor *)0x0;
    this = local_100;
    pDVar11 = local_158;
  }
LAB_003076ed:
  if ((pFVar14 == (FieldDescriptor *)0x0) && (!bVar6)) {
    if (this->allow_unknown_field_ != false) {
      local_218._8_8_ = pDVar11->all_names_[1]._M_dataplus._M_p;
      local_218._M_allocated_capacity = pDVar11->all_names_[1]._M_string_length;
      _val = (pointer)0xe;
      local_220 = "Message type \"";
      local_208[0] = '\x16';
      local_208[1] = '\0';
      local_208[2] = '\0';
      local_208[3] = '\0';
      local_208[4] = '\0';
      local_208[5] = '\0';
      local_208[6] = '\0';
      local_208[7] = '\0';
      local_200 = "\" has no field named \"";
      local_1f8 = field_name._M_string_length;
      local_1f0 = field_name._M_dataplus._M_p;
      local_1e8 = 2;
      local_1e0 = "\".";
      absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_258,&val,5);
      message_04._M_str = (char *)local_258._0_8_;
      message_04._M_len = local_258._8_8_;
      ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                    message_04);
      if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      goto LAB_003077b7;
    }
    local_218._8_8_ = pDVar11->all_names_[1]._M_dataplus._M_p;
    local_218._M_allocated_capacity = pDVar11->all_names_[1]._M_string_length;
    _val = (pointer)0xe;
    local_220 = "Message type \"";
    local_208[0] = '\x16';
    local_208[1] = '\0';
    local_208[2] = '\0';
    local_208[3] = '\0';
    local_208[4] = '\0';
    local_208[5] = '\0';
    local_208[6] = '\0';
    local_208[7] = '\0';
    local_200 = "\" has no field named \"";
    local_1f8 = field_name._M_string_length;
    local_1f0 = field_name._M_dataplus._M_p;
    local_1e8 = 2;
    local_1e0 = "\".";
    absl::lts_20240722::strings_internal::CatPieces_abi_cxx11_(local_258,&val,5);
    message_08._M_str = (char *)local_258._0_8_;
    message_08._M_len = local_258._8_8_;
    ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,message_08)
    ;
LAB_00307d0d:
    _Var17._M_p = (pointer)local_258._0_8_;
    if ((undefined1 *)local_258._0_8_ == local_258 + 0x10) goto LAB_00308116;
    goto LAB_00307d24;
  }
LAB_003077b7:
  if (pFVar14 == (FieldDescriptor *)0x0) {
    if ((this->allow_unknown_field_ == false) && (this->allow_unknown_extension_ == false)) {
      bVar6 = (bool)(bVar6 ^ 1);
    }
    else {
      bVar6 = false;
    }
    if ((bVar6) &&
       (absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)local_130,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/text_format.cc"
                   ,0x281,0x42,"allow_unknown_field_ || allow_unknown_extension_ || reserved_field")
       , bVar6)) {
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)local_130);
    }
    _val = (pointer)&local_218;
    std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
    bVar6 = TryConsumeBeforeWhitespace(this,(string *)&val);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_val != &local_218) {
      operator_delete(_val,local_218._M_allocated_capacity + 1);
    }
    if (bVar6) {
      TryConsumeWhitespace(this);
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,"{","");
      pcVar5 = (char *)(this->tokenizer_).current_.text._M_string_length;
      if (pcVar5 == local_220) {
        if (pcVar5 == (char *)0x0) {
          bVar6 = true;
        }
        else {
          iVar9 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,_val,(size_t)pcVar5);
          bVar6 = iVar9 == 0;
        }
      }
      else {
        bVar6 = false;
      }
      if (bVar6) {
LAB_00307d3c:
        bVar8 = false;
      }
      else {
        local_258._0_8_ = local_258 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"<","");
        __n_00 = (pointer)(this->tokenizer_).current_.text._M_string_length;
        bVar8 = true;
        if (__n_00 == (pointer)local_258._8_8_) {
          if (__n_00 == (pointer)0x0) goto LAB_00307d3c;
          iVar9 = bcmp((this->tokenizer_).current_.text._M_dataplus._M_p,(void *)local_258._0_8_,
                       (size_t)__n_00);
          bVar8 = iVar9 != 0;
        }
      }
      if ((!bVar6) && ((undefined1 *)local_258._0_8_ != local_258 + 0x10)) {
        operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (bVar8) {
        bVar6 = SkipFieldValue(this);
        goto LAB_00308118;
      }
    }
    bVar6 = SkipFieldMessage(this);
    goto LAB_00308118;
  }
  if ((pFVar14->options_->field_0)._impl_.deprecated_ == true) {
    _val = (pointer)0x27;
    local_220 = "text format contains deprecated field \"";
    local_258._0_8_ = field_name._M_string_length;
    local_258._8_8_ = field_name._M_dataplus._M_p;
    local_130._0_8_ = (pointer)0x1;
    local_130._8_8_ = "\"";
    absl::lts_20240722::StrCat_abi_cxx11_
              ((AlphaNum *)&full_type_name,(AlphaNum *)&val,(AlphaNum *)local_258);
    message_05._M_str = full_type_name._M_dataplus._M_p;
    message_05._M_len = full_type_name._M_string_length;
    ReportWarning(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  message_05);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
      operator_delete(full_type_name._M_dataplus._M_p,
                      CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                               full_type_name.field_2._M_local_buf[0]) + 1);
    }
  }
  if (this->singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
    bVar2 = pFVar14->field_0x1;
    bVar6 = (bool)((bVar2 & 0x20) >> 5);
    if (0xbf < bVar2 == bVar6) {
      psVar15 = (string *)0x0;
    }
    else {
      psVar15 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                          (bVar6,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
    }
    if (psVar15 != (string *)0x0) {
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&val,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                 ,0xab7,*(undefined8 *)(psVar15 + 8),*(undefined8 *)psVar15);
      goto LAB_00308205;
    }
    if (((pFVar14->field_0x1 & 0x20) == 0) &&
       (bVar6 = Reflection::HasField(this_01,message,pFVar14), bVar6)) {
      _val = (pointer)0x14;
      local_220 = "Non-repeated field \"";
      local_258._0_8_ = field_name._M_string_length;
      local_258._8_8_ = field_name._M_dataplus._M_p;
      local_130._0_8_ = (pointer)0x1e;
      local_130._8_8_ = "\" is specified multiple times.";
      absl::lts_20240722::StrCat_abi_cxx11_
                ((AlphaNum *)&full_type_name,(AlphaNum *)&val,(AlphaNum *)local_258);
      message_06._M_str = full_type_name._M_dataplus._M_p;
      message_06._M_len = full_type_name._M_string_length;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  message_06);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)full_type_name._M_dataplus._M_p != &full_type_name.field_2) {
        local_258._16_8_ =
             CONCAT71(full_type_name.field_2._M_allocated_capacity._1_7_,
                      full_type_name.field_2._M_local_buf[0]);
        _Var17 = full_type_name._M_dataplus;
LAB_00307d24:
        operator_delete(_Var17._M_p,local_258._16_8_ + 1);
      }
    }
    else {
      if ((pFVar14->field_0x1 & 0x10) == 0) {
        oneof_descriptor = (OneofDescriptor *)0x0;
      }
      else {
        oneof_descriptor = (pFVar14->scope_).containing_oneof;
        if (oneof_descriptor == (OneofDescriptor *)0x0) {
          internal::protobuf_assumption_failed
                    ("res != nullptr",
                     "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                     ,0xa9a);
        }
      }
      if ((oneof_descriptor == (OneofDescriptor *)0x0) ||
         (bVar6 = Reflection::HasOneof(this_01,message,oneof_descriptor), !bVar6))
      goto LAB_00307aa1;
      pFVar14 = Reflection::GetOneofFieldDescriptor(this_01,message,oneof_descriptor);
      _val = (pointer)0x7;
      local_220 = "Field \"";
      local_258._0_8_ = field_name._M_string_length;
      local_258._8_8_ = field_name._M_dataplus._M_p;
      local_130._0_8_ = (pointer)0x21;
      local_130._8_8_ = "\" is specified along with field \"";
      full_type_name._M_string_length = (size_type)(pFVar14->all_names_->_M_dataplus)._M_p;
      full_type_name._M_dataplus._M_p = (pointer)pFVar14->all_names_->_M_string_length;
      prefix._M_dataplus._M_p = (pointer)0x1c;
      prefix._M_string_length = (size_type)anon_var_dwarf_a7f2af;
      absl::lts_20240722::StrCat<std::__cxx11::string,char[3]>
                (&prefix_and_full_type_name,(lts_20240722 *)&val,(AlphaNum *)local_258,
                 (AlphaNum *)local_130,(AlphaNum *)&full_type_name,(AlphaNum *)&prefix,
                 (AlphaNum *)oneof_descriptor->all_names_,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x383111,
                 (char (*) [3])message);
      message_07._M_str = prefix_and_full_type_name._M_dataplus._M_p;
      message_07._M_len = prefix_and_full_type_name._M_string_length;
      ReportError(this,(this->tokenizer_).current_.line,(this->tokenizer_).current_.column,
                  message_07);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)prefix_and_full_type_name._M_dataplus._M_p != &prefix_and_full_type_name.field_2) {
        local_258._16_8_ =
             CONCAT71(prefix_and_full_type_name.field_2._M_allocated_capacity._1_7_,
                      prefix_and_full_type_name.field_2._M_local_buf[0]);
        _Var17 = prefix_and_full_type_name._M_dataplus;
        goto LAB_00307d24;
      }
    }
LAB_00308116:
    bVar6 = false;
  }
  else {
LAB_00307aa1:
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar14->type_ * 4) == 10) {
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
      bVar6 = TryConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      iVar9 = 0;
      if ((((bVar6) && (TryConsumeWhitespace(this), bVar6)) &&
          ((pFVar14->options_->field_0)._impl_.weak_ == true)) &&
         ((this->tokenizer_).current_.type == TYPE_STRING)) {
        local_220 = (char *)0x0;
        local_218._M_allocated_capacity = local_218._M_allocated_capacity & 0xffffffffffffff00;
        _val = (pointer)&local_218;
        bVar6 = ConsumeString(this,(string *)&val);
        iVar9 = 1;
        if (bVar6) {
          pFVar3 = this->finder_;
          if (pFVar3 == (Finder *)0x0) {
            factory = (MessageFactory *)0x0;
          }
          else {
            iVar9 = (*pFVar3->_vptr_Finder[5])(pFVar3,pFVar14);
            factory = (MessageFactory *)CONCAT44(extraout_var_02,iVar9);
          }
          this_00 = &Reflection::MutableMessage(this_01,message,pFVar14,factory)->super_MessageLite;
          iVar9 = 2;
          data._M_str = _val;
          data._M_len = (size_t)local_220;
          MessageLite::ParseFromString(this_00,data);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_val != &local_218) {
          operator_delete(_val,local_218._M_allocated_capacity + 1);
        }
      }
      if (iVar9 == 0) goto LAB_00307e34;
      if (iVar9 != 2) goto LAB_00308116;
    }
    else {
      _val = (pointer)&local_218;
      std::__cxx11::string::_M_construct<char_const*>((string *)&val,":","");
      bVar6 = ConsumeBeforeWhitespace(this,(string *)&val);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (!bVar6) goto LAB_00308116;
      TryConsumeWhitespace(this);
LAB_00307e34:
      bVar2 = pFVar14->field_0x1;
      bVar6 = (bool)((bVar2 & 0x20) >> 5);
      if (0xbf < bVar2 == bVar6) {
        psVar15 = (string *)0x0;
      }
      else {
        psVar15 = absl::lts_20240722::log_internal::MakeCheckOpString<bool,bool>
                            (bVar6,0xbf < bVar2,"is_repeated_ == label() == LABEL_REPEATED");
      }
      if (psVar15 != (string *)0x0) {
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  ((LogMessageFatal *)&val,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O1/_deps/protobuf-src/src/google/protobuf/descriptor.h"
                   ,0xab7,*(undefined8 *)(psVar15 + 8),*(undefined8 *)psVar15);
LAB_00308205:
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&val)
        ;
      }
      bVar2 = pFVar14->field_0x1;
      if ((bVar2 & 0x20) == 0) {
        bVar6 = false;
      }
      else {
        _val = (pointer)&local_218;
        std::__cxx11::string::_M_construct<char_const*>((string *)&val,"[","");
        bVar6 = TryConsume(this,(string *)&val);
      }
      if (((bVar2 & 0x20) != 0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_val != &local_218)) {
        operator_delete(_val,local_218._M_allocated_capacity + 1);
      }
      if (bVar6 == false) {
        if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar14->type_ * 4) == 10) {
          bVar6 = ConsumeFieldMessage(this,message,this_01,pFVar14);
        }
        else {
          bVar6 = ConsumeFieldValue(this,message,this_01,pFVar14);
        }
        if (bVar6 == false) goto LAB_00308116;
      }
      else {
        pcVar5 = local_258 + 0x10;
        local_258._0_8_ = pcVar5;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"]","");
        bVar6 = TryConsume(this,(string *)local_258);
        if ((char *)local_258._0_8_ != pcVar5) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        if (!bVar6) {
          do {
            if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pFVar14->type_ * 4) == 10) {
              bVar6 = ConsumeFieldMessage(this,message,this_01,pFVar14);
            }
            else {
              bVar6 = ConsumeFieldValue(this,message,this_01,pFVar14);
            }
            if (bVar6 == false) goto LAB_00308116;
            local_258._0_8_ = pcVar5;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_258,"]","");
            bVar6 = TryConsume(this,(string *)local_258);
            if ((char *)local_258._0_8_ != pcVar5) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            if (bVar6) goto LAB_00308035;
            local_258._0_8_ = pcVar5;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_258,",","");
            bVar8 = Consume(this,(string *)local_258);
            if ((char *)local_258._0_8_ != pcVar5) {
              operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
            }
            bVar6 = false;
          } while (bVar8);
          goto LAB_00308118;
        }
      }
    }
LAB_00308035:
    local_258._0_8_ = local_258 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_258,";","");
    bVar6 = TryConsume(this,(string *)local_258);
    if (!bVar6) {
      local_130._0_8_ = local_130 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_130,",","");
      TryConsume(this,(string *)local_130);
      if ((!bVar6) && ((undefined1 *)local_130._0_8_ != local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,local_130._16_8_ + 1);
      }
    }
    if ((undefined1 *)local_258._0_8_ != local_258 + 0x10) {
      operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
    }
    bVar6 = true;
    if (this->parse_info_tree_ != (ParseInfoTree *)0x0) {
      range.start = (ParseLocation)((local_e8 << 0x20) + local_f0);
      range.end.column = (this->tokenizer_).previous_.end_column;
      range.end.line = (this->tokenizer_).previous_.line;
      ParseInfoTree::RecordLocation(this->parse_info_tree_,pFVar14,range);
    }
  }
LAB_00308118:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)field_name._M_dataplus._M_p != &field_name.field_2) {
    operator_delete(field_name._M_dataplus._M_p,
                    CONCAT71(field_name.field_2._M_allocated_capacity._1_7_,
                             field_name.field_2._M_local_buf[0]) + 1);
  }
  return bVar6;
}

Assistant:

bool ConsumeField(Message* message) {
    const Reflection* reflection = message->GetReflection();
    const Descriptor* descriptor = message->GetDescriptor();

    std::string field_name;
    bool reserved_field = false;
    const FieldDescriptor* field = nullptr;
    int start_line = tokenizer_.current().line;
    int start_column = tokenizer_.current().column;

    const FieldDescriptor* any_type_url_field;
    const FieldDescriptor* any_value_field;
    if (internal::GetAnyFieldDescriptors(*message, &any_type_url_field,
                                         &any_value_field) &&
        TryConsume("[")) {
      std::string full_type_name, prefix;
      DO(ConsumeAnyTypeUrl(&full_type_name, &prefix));
      std::string prefix_and_full_type_name =
          absl::StrCat(prefix, full_type_name);
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();
      // ':' is optional between message labels and values.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
      }
      std::string serialized_value;
      const Descriptor* value_descriptor =
          finder_ ? finder_->FindAnyType(*message, prefix, full_type_name)
                  : DefaultFinderFindAnyType(*message, prefix, full_type_name);
      if (value_descriptor == nullptr) {
        ReportError(absl::StrCat("Could not find type \"",
                                 prefix_and_full_type_name,
                                 "\" stored in google.protobuf.Any."));
        return false;
      }
      DO(ConsumeAnyValue(value_descriptor, &serialized_value));
      if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
        // Fail if any_type_url_field has already been specified.
        if ((!any_type_url_field->is_repeated() &&
             reflection->HasField(*message, any_type_url_field)) ||
            (!any_value_field->is_repeated() &&
             reflection->HasField(*message, any_value_field))) {
          ReportError("Non-repeated Any specified multiple times.");
          return false;
        }
      }
      reflection->SetString(message, any_type_url_field,
                            std::move(prefix_and_full_type_name));
      reflection->SetString(message, any_value_field,
                            std::move(serialized_value));
      return true;
    }
    if (TryConsume("[")) {
      // Extension.
      DO(ConsumeFullTypeName(&field_name));
      DO(ConsumeBeforeWhitespace("]"));
      TryConsumeWhitespace();

      field = finder_ ? finder_->FindExtension(message, field_name)
                      : DefaultFinderFindExtension(message, field_name);

      if (field == nullptr) {
        if (!allow_unknown_field_ && !allow_unknown_extension_) {
          ReportError(absl::StrCat("Extension \"", field_name,
                                   "\" is not defined or "
                                   "is not an extension of \"",
                                   descriptor->full_name(), "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat(
              "Ignoring extension \"", field_name,
              "\" which is not defined or is not an extension of \"",
              descriptor->full_name(), "\"."));
        }
      }
    } else {
      DO(ConsumeIdentifierBeforeWhitespace(&field_name));
      TryConsumeWhitespace();

      int32_t field_number;
      if (allow_field_number_ && absl::SimpleAtoi(field_name, &field_number)) {
        if (descriptor->IsExtensionNumber(field_number)) {
          field = finder_
                      ? finder_->FindExtensionByNumber(descriptor, field_number)
                      : DefaultFinderFindExtensionByNumber(descriptor,
                                                           field_number);
        } else if (descriptor->IsReservedNumber(field_number)) {
          reserved_field = true;
        } else {
          field = descriptor->FindFieldByNumber(field_number);
        }
      } else {
        field = descriptor->FindFieldByName(field_name);
        // Group-like delimited fields will accept both the capitalized type
        // names as well.
        if (field == nullptr) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByName(lower_field_name);
          // If the case-insensitive match worked but the field is NOT a group,
          if (field != nullptr && !internal::cpp::IsGroupLike(*field)) {
            field = nullptr;
          }
          if (field != nullptr && field->message_type()->name() != field_name) {
            field = nullptr;
          }
        }

        if (field == nullptr && allow_case_insensitive_field_) {
          std::string lower_field_name = field_name;
          absl::AsciiStrToLower(&lower_field_name);
          field = descriptor->FindFieldByLowercaseName(lower_field_name);
        }

        if (field == nullptr) {
          reserved_field = descriptor->IsReservedName(field_name);
        }
      }
      if (field == nullptr && !reserved_field) {
        if (!allow_unknown_field_) {
          ReportError(absl::StrCat("Message type \"", descriptor->full_name(),
                                   "\" has no field named \"", field_name,
                                   "\"."));
          return false;
        } else {
          ReportWarning(absl::StrCat("Message type \"", descriptor->full_name(),
                                     "\" has no field named \"", field_name,
                                     "\"."));
        }
      }
    }

    // Skips unknown or reserved fields.
    if (field == nullptr) {
      ABSL_CHECK(allow_unknown_field_ || allow_unknown_extension_ ||
                 reserved_field);

      // Try to guess the type of this field.
      // If this field is not a message, there should be a ":" between the
      // field name and the field value and also the field value should not
      // start with "{" or "<" which indicates the beginning of a message body.
      // If there is no ":" or there is a "{" or "<" after ":", this field has
      // to be a message or the input is ill-formed.
      if (TryConsumeBeforeWhitespace(":")) {
        TryConsumeWhitespace();
        if (!LookingAt("{") && !LookingAt("<")) {
          return SkipFieldValue();
        }
      }
      return SkipFieldMessage();
    }

    if (field->options().deprecated()) {
      ReportWarning(absl::StrCat("text format contains deprecated field \"",
                                 field_name, "\""));
    }

    if (singular_overwrite_policy_ == FORBID_SINGULAR_OVERWRITES) {
      // Fail if the field is not repeated and it has already been specified.
      if (!field->is_repeated() && reflection->HasField(*message, field)) {
        ReportError(absl::StrCat("Non-repeated field \"", field_name,
                                 "\" is specified multiple times."));
        return false;
      }
      // Fail if the field is a member of a oneof and another member has already
      // been specified.
      const OneofDescriptor* oneof = field->containing_oneof();
      if (oneof != nullptr && reflection->HasOneof(*message, oneof)) {
        const FieldDescriptor* other_field =
            reflection->GetOneofFieldDescriptor(*message, oneof);
        ReportError(absl::StrCat("Field \"", field_name,
                                 "\" is specified along with "
                                 "field \"",
                                 other_field->name(),
                                 "\", another member "
                                 "of oneof \"",
                                 oneof->name(), "\"."));
        return false;
      }
    }

    // Perform special handling for embedded message types.
    if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      // ':' is optional here.
      bool consumed_semicolon = TryConsumeBeforeWhitespace(":");
      if (consumed_semicolon) {
        TryConsumeWhitespace();
      }
      if (consumed_semicolon && field->options().weak() &&
          LookingAtType(io::Tokenizer::TYPE_STRING)) {
        // we are getting a bytes string for a weak field.
        std::string tmp;
        DO(ConsumeString(&tmp));
        MessageFactory* factory =
            finder_ ? finder_->FindExtensionFactory(field) : nullptr;
        reflection->MutableMessage(message, field, factory)
            ->ParseFromString(tmp);
        goto label_skip_parsing;
      }
    } else {
      // ':' is required here.
      DO(ConsumeBeforeWhitespace(":"));
      TryConsumeWhitespace();
    }

    if (field->is_repeated() && TryConsume("[")) {
      // Short repeated format, e.g.  "foo: [1, 2, 3]".
      if (!TryConsume("]")) {
        // "foo: []" is treated as empty.
        while (true) {
          if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
            // Perform special handling for embedded message types.
            DO(ConsumeFieldMessage(message, reflection, field));
          } else {
            DO(ConsumeFieldValue(message, reflection, field));
          }
          if (TryConsume("]")) {
            break;
          }
          DO(Consume(","));
        }
      }
    } else if (field->cpp_type() == FieldDescriptor::CPPTYPE_MESSAGE) {
      DO(ConsumeFieldMessage(message, reflection, field));
    } else {
      DO(ConsumeFieldValue(message, reflection, field));
    }
  label_skip_parsing:
    // For historical reasons, fields may optionally be separated by commas or
    // semicolons.
    TryConsume(";") || TryConsume(",");

    // If a parse info tree exists, add the location for the parsed
    // field.
    if (parse_info_tree_ != nullptr) {
      int end_line = tokenizer_.previous().line;
      int end_column = tokenizer_.previous().end_column;

      RecordLocation(parse_info_tree_, field,
                     ParseLocationRange(ParseLocation(start_line, start_column),
                                        ParseLocation(end_line, end_column)));
    }

    return true;
  }